

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  GCproto *pt;
  GCfunc *pGVar7;
  uint64_t uVar8;
  GCstr *pGVar9;
  TValue TVar10;
  uint8_t uVar11;
  lua_CFunction *pp_Var12;
  byte *str;
  byte *pbVar13;
  GCtab *t;
  TValue *pTVar14;
  MSize nelems;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  GCfunc *local_128;
  uint64_t local_118;
  GCtab *local_108;
  lua_CFunction *local_100;
  LexState local_e8;
  
  uVar8 = (L->glref).ptr64;
  local_108 = (GCtab *)(L->env).gcptr64;
  uVar11 = *p;
  bVar1 = p[1];
  bVar2 = p[2];
  if (libname == (char *)0x0) {
    lua_createtable(L,0,(uint)bVar2);
  }
  else {
    luaL_findtable(L,-10000,"_LOADED",0x10);
    lua_getfield(L,-1,libname);
    if ((L->top[-1].u64 & 0xffff800000000000) != 0xfffa000000000000) {
      L->top = L->top + -1;
      pcVar5 = luaL_findtable(L,-0x2712,libname,(uint)bVar2);
      if (pcVar5 != (char *)0x0) {
        lj_err_callerv(L,LJ_ERR_BADMODN,libname);
      }
      L->top->u64 = L->top[-1].u64 & 0x7fffffffffff | 0xfffa000000000000;
      L->top = L->top + 1;
      lua_setfield(L,-3,libname);
    }
    pTVar14 = L->top;
    L->top = pTVar14 + -1;
    pTVar14[-2].u64 = pTVar14[-1].u64 & 0x7fffffffffff | 0xfffa000000000000;
  }
  t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
  lVar6 = (long)L->top - (long)L->base;
  if ((t->marked & 4) != 0) {
    uVar3 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar3 + 0x40);
    *(GCtab **)(uVar3 + 0x40) = t;
  }
  local_118 = uVar8 + (ulong)bVar1 * 4 + 0x1718;
  pbVar13 = p + 3;
  t->nomm = '\0';
  local_128 = (GCfunc *)0x0;
  local_100 = cf;
  do {
    str = pbVar13 + 1;
    bVar1 = *pbVar13;
    uVar17 = bVar1 & 0x3f;
    uVar16 = bVar1 & 0xffffffc0;
    if (uVar16 != 0xc0) {
      uVar15 = ((ulong)((long)L->top - (long)L->base) >> 3) - (lVar6 >> 3);
      nelems = (MSize)uVar15;
      pGVar7 = lj_func_newC(L,nelems,local_108);
      if (nelems != 0) {
        pTVar14 = (TValue *)((long)L->base + lVar6);
        L->top = pTVar14;
        memcpy((pGVar7->c).upvalue,pTVar14,(uVar15 & 0xffffffff) << 3);
      }
      (pGVar7->c).ffid = uVar11;
      if ((bVar1 & 0xc0) == 0) {
        uVar8 = (L->glref).ptr64 + 0x168;
      }
      else {
        uVar8 = local_118;
        local_118 = local_118 + 4;
      }
      uVar11 = uVar11 + '\x01';
      pbVar13 = str + uVar17;
      (pGVar7->c).pc.ptr64 = uVar8;
      pp_Var12 = &(local_128->c).f;
      if (uVar16 != 0x80) {
        pp_Var12 = local_100;
      }
      local_100 = local_100 + (uVar16 != 0x80);
      (pGVar7->c).f = *pp_Var12;
      bVar4 = true;
      local_128 = pGVar7;
      if ((bVar1 & 0x3f) != 0) {
        pGVar9 = lj_str_new(L,(char *)str,(ulong)uVar17);
        pTVar14 = lj_tab_setstr(L,t,pGVar9);
        pTVar14->u64 = (ulong)pGVar7 | 0xfffb800000000000;
      }
      goto LAB_00117c18;
    }
    switch(bVar1) {
    case 0xf9:
      bVar1 = pbVar13[1];
      pGVar9 = lj_str_new(L,(char *)(pbVar13 + 2),(ulong)bVar1);
      memset(&local_e8,0,0xb8);
      local_e8.p = (char *)(pbVar13 + (ulong)bVar1 + 2);
      local_e8.pe = (char *)0xffffffffffffffff;
      local_e8.c = -1;
      local_e8.level = 2;
      local_e8.L = L;
      local_e8.chunkname = pGVar9;
      pt = lj_bcread_proto(&local_e8);
      pt->firstline = -1;
      pGVar7 = lj_func_newL_empty(L,pt,(GCtab *)(L->env).gcptr64);
      pTVar14 = lj_tab_setstr(L,t,pGVar9);
      pTVar14->u64 = (ulong)pGVar7 | 0xfffb800000000000;
      str = (byte *)local_e8.p;
      break;
    case 0xfa:
      pTVar14 = L->top;
      L->top = pTVar14 + -2;
      if (((pTVar14[-1].u64 & 0xffff800000000000) != 0xfffd800000000000) ||
         (*(int *)((pTVar14[-1].u64 & 0x7fffffffffff) + 0x14) != 0)) {
        pTVar14 = lj_tab_set(L,t,pTVar14 + -1);
        TVar10 = *L->top;
        goto LAB_00117c0c;
      }
      local_108 = (GCtab *)(pTVar14[-2].u64 & 0x7fffffffffff);
      break;
    case 0xfb:
      *L->top = *(TValue *)(pbVar13 + 1);
      L->top = L->top + 1;
      pbVar13 = pbVar13 + 9;
      goto LAB_00117b6b;
    case 0xfc:
      *L->top = L->top[-(ulong)pbVar13[1]];
      L->top = L->top + 1;
      pbVar13 = pbVar13 + 2;
LAB_00117b6b:
      bVar4 = true;
      goto LAB_00117c18;
    case 0xfd:
      pTVar14 = L->top;
      L->top = pTVar14 + 1;
      TVar10.u64 = (ulong)local_128 | 0xfffb800000000000;
LAB_00117c0c:
      pTVar14->u64 = (uint64_t)TVar10;
      break;
    case 0xfe:
      uVar11 = uVar11 + '\x01';
      break;
    case 0xff:
      bVar4 = false;
      pbVar13 = str;
      goto LAB_00117c18;
    default:
      pTVar14 = L->top;
      L->top = pTVar14 + 1;
      pGVar9 = lj_str_new(L,(char *)str,(ulong)uVar17);
      pTVar14->u64 = (ulong)pGVar9 | 0xfffd800000000000;
      str = str + uVar17;
    }
    bVar4 = true;
    pbVar13 = str;
LAB_00117c18:
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}